

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O2

_Bool chck_pool(chck_pool *pool,size_t grow,size_t capacity,size_t member_size)

{
  _Bool _Var1;
  ulong uVar2;
  
  if ((pool == (chck_pool *)0x0) || (member_size == 0)) {
    __assert_fail("pool && member_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c"
                  ,0x11c,"_Bool chck_pool(struct chck_pool *, size_t, size_t, size_t)");
  }
  memset(pool,0,0x90);
  _Var1 = pool_buffer(&pool->items,grow,capacity,member_size);
  if ((_Var1) && (_Var1 = pool_buffer(&pool->map,grow,capacity,1), _Var1)) {
    uVar2 = 0x20;
    if (grow != 0) {
      uVar2 = grow;
    }
    (pool->removed).step = uVar2 << 3;
    if (uVar2 >> 0x3d == 0) {
      (pool->removed).member = 8;
      return true;
    }
  }
  return false;
}

Assistant:

bool
chck_pool(struct chck_pool *pool, size_t grow, size_t capacity, size_t member_size)
{
   assert(pool && member_size > 0);

   if (unlikely(!member_size))
      return false;

   *pool = (struct chck_pool){0};
   return (pool_buffer(&pool->items, grow, capacity, member_size) &&
           pool_buffer(&pool->map, grow, capacity, sizeof(bool)) &&
           pool_buffer(&pool->removed, grow, 0, sizeof(size_t)));
}